

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise.cpp
# Opt level: O2

int __thiscall
ncnn::DeconvolutionDepthWise::forward
          (DeconvolutionDepthWise *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  size_t _elemsize;
  void *pvVar4;
  float *pfVar5;
  void *pvVar6;
  void *pvVar7;
  int k_1;
  int iVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  size_type __n;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  int iVar23;
  long lVar24;
  int k;
  ulong uVar25;
  ulong uVar26;
  int i_3;
  int iVar27;
  int i_7;
  ulong uVar28;
  uint uVar29;
  float fVar30;
  float fVar31;
  int local_1b8;
  long local_1a8;
  Mat m;
  long local_148;
  Mat top_blob_bordered;
  vector<int,_std::allocator<int>_> _space_ofs;
  Mat m_1;
  
  iVar23 = bottom_blob->c;
  if (iVar23 % this->group != 0) {
    return -100;
  }
  if (this->num_output % this->group != 0) {
    return -100;
  }
  uVar3 = bottom_blob->w;
  uVar29 = bottom_blob->h;
  uVar25 = (ulong)uVar29;
  _elemsize = bottom_blob->elemsize;
  iVar27 = (this->kernel_w + -1) * this->dilation_w + (uVar3 - 1) * this->stride_w + 1;
  iVar8 = (uVar29 - 1) * this->stride_h + (this->kernel_h + -1) * this->dilation_h + 1;
  top_blob_bordered.elemsize._0_4_ = 0;
  top_blob_bordered.elemsize._4_4_ = 0;
  top_blob_bordered.packing = 0;
  top_blob_bordered.data = (void *)0x0;
  top_blob_bordered.refcount._0_4_ = 0;
  top_blob_bordered.refcount._4_4_ = 0;
  top_blob_bordered.allocator = (Allocator *)0x0;
  top_blob_bordered.dims = 0;
  top_blob_bordered.w = 0;
  top_blob_bordered.h = 0;
  top_blob_bordered.c = 0;
  top_blob_bordered.cstep = 0;
  if ((this->pad_w < 1) && (this->pad_h < 1)) {
    Mat::operator=(&top_blob_bordered,top_blob);
    Mat::create(&top_blob_bordered,iVar27,iVar8,this->num_output,_elemsize,opt->blob_allocator);
  }
  else {
    Mat::create(&top_blob_bordered,iVar27,iVar8,this->num_output,_elemsize,opt->workspace_allocator)
    ;
  }
  iVar19 = -100;
  if ((top_blob_bordered.data == (void *)0x0) ||
     ((long)top_blob_bordered.c * top_blob_bordered.cstep == 0)) goto LAB_00141847;
  uVar9 = this->kernel_w * this->kernel_h;
  __n = (size_type)(int)uVar9;
  std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,__n,(allocator_type *)&m);
  iVar19 = this->dilation_h;
  iVar13 = this->kernel_w;
  iVar14 = this->dilation_w * iVar13;
  iVar18 = 0;
  lVar21 = 0;
  for (iVar15 = 0; iVar15 < this->kernel_h; iVar15 = iVar15 + 1) {
    for (lVar24 = 0; (int)lVar24 < iVar13; lVar24 = lVar24 + 1) {
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[(int)lVar21 + lVar24] = iVar18;
      iVar18 = iVar18 + this->dilation_w;
      iVar13 = this->kernel_w;
    }
    iVar18 = iVar18 + (iVar19 * iVar27 - iVar14);
    lVar21 = (int)lVar21 + lVar24;
  }
  iVar19 = this->group;
  if (iVar19 == this->num_output && iVar23 == iVar19) {
    uVar28 = 0;
    if (0 < (int)uVar9) {
      uVar28 = (ulong)uVar9;
    }
    uVar16 = 0;
    if (0 < (int)uVar3) {
      uVar16 = (ulong)uVar3;
    }
    if ((int)uVar29 < 1) {
      uVar25 = 0;
    }
    local_1a8 = 0;
    uVar29 = iVar8 * iVar27;
    if (iVar8 * iVar27 < 1) {
      uVar29 = 0;
    }
    uVar20 = (ulong)uVar29;
    for (lVar21 = 0; lVar21 < iVar23; lVar21 = lVar21 + 1) {
      Mat::channel(&m,bottom_blob,(int)lVar21);
      pvVar6 = m.data;
      Mat::~Mat(&m);
      pvVar4 = (this->weight_data).data;
      m.elemsize = CONCAT44(top_blob_bordered.elemsize._4_4_,(undefined4)top_blob_bordered.elemsize)
      ;
      m.data = (void *)(top_blob_bordered.cstep * lVar21 * m.elemsize + (long)top_blob_bordered.data
                       );
      m.refcount = (int *)0x0;
      m.packing = top_blob_bordered.packing;
      m.allocator = top_blob_bordered.allocator;
      m.dims = 2;
      m.w = top_blob_bordered.w;
      m.h = top_blob_bordered.h;
      m.c = 1;
      m.cstep = (size_t)(top_blob_bordered.h * top_blob_bordered.w);
      if (this->bias_term == 0) {
        fVar30 = 0.0;
      }
      else {
        fVar30 = *(float *)((long)(this->bias_data).data + lVar21 * 4);
      }
      Mat::fill(&m,fVar30);
      pvVar7 = m.data;
      for (uVar11 = 0; uVar11 != uVar25; uVar11 = uVar11 + 1) {
        iVar23 = this->stride_h;
        iVar8 = this->stride_w;
        for (uVar22 = 0; uVar22 != uVar16; uVar22 = uVar22 + 1) {
          lVar24 = uVar22 * (long)iVar8 * 4 +
                   (long)m.w * (long)(int)uVar11 * (long)iVar23 * m.elemsize;
          for (uVar26 = 0; uVar28 != uVar26; uVar26 = uVar26 + 1) {
            *(float *)((long)m.data +
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar26] * 4 + lVar24) =
                 *(float *)((long)pvVar4 + uVar26 * 4 + local_1a8) *
                 *(float *)((long)pvVar6 + uVar22 * 4 + uVar11 * (long)(int)uVar3 * 4) +
                 *(float *)((long)m.data +
                           (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[uVar26] * 4 + lVar24);
          }
        }
      }
      switch(this->activation_type) {
      case 1:
        for (uVar11 = 0; uVar20 != uVar11; uVar11 = uVar11 + 1) {
          fVar30 = *(float *)((long)m.data + uVar11 * 4);
          if (fVar30 <= 0.0) {
            fVar30 = 0.0;
          }
          *(float *)((long)m.data + uVar11 * 4) = fVar30;
        }
        break;
      case 2:
        uVar29 = *(this->activation_params).data;
        for (uVar11 = 0; uVar20 != uVar11; uVar11 = uVar11 + 1) {
          fVar30 = *(float *)((long)m.data + uVar11 * 4);
          uVar9 = -(uint)(0.0 < fVar30);
          *(float *)((long)m.data + uVar11 * 4) =
               (float)(~uVar9 & uVar29 | uVar9 & 0x3f800000) * fVar30;
        }
        break;
      case 3:
        pfVar5 = (float *)(this->activation_params).data;
        fVar30 = *pfVar5;
        fVar1 = pfVar5[1];
        for (uVar11 = 0; uVar20 != uVar11; uVar11 = uVar11 + 1) {
          fVar2 = *(float *)((long)m.data + uVar11 * 4);
          fVar31 = fVar2;
          if (fVar2 <= fVar30) {
            fVar31 = fVar30;
          }
          if ((fVar2 < fVar30) || (fVar1 < fVar31)) {
            if (fVar1 <= fVar31) {
              fVar31 = fVar1;
            }
            *(float *)((long)m.data + uVar11 * 4) = fVar31;
          }
        }
        break;
      case 4:
        for (uVar11 = 0; uVar20 != uVar11; uVar11 = uVar11 + 1) {
          fVar30 = expf(-*(float *)((long)pvVar7 + uVar11 * 4));
          *(float *)((long)pvVar7 + uVar11 * 4) = 1.0 / (fVar30 + 1.0);
        }
      }
      Mat::~Mat(&m);
      iVar23 = this->group;
      local_1a8 = local_1a8 + __n * 4;
    }
  }
  else {
    iVar23 = iVar23 / iVar19;
    uVar10 = this->num_output / iVar19;
    uVar16 = 0;
    uVar28 = 0;
    if (0 < (int)uVar9) {
      uVar28 = (ulong)uVar9;
    }
    iVar13 = 0;
    if (0 < iVar23) {
      iVar13 = iVar23;
    }
    uVar20 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar20 = uVar16;
    }
    if ((int)uVar29 < 1) {
      uVar25 = uVar16;
    }
    uVar11 = 0;
    if (0 < (int)uVar10) {
      uVar11 = (ulong)uVar10;
    }
    iVar14 = 0;
    uVar22 = (ulong)(uint)(iVar8 * iVar27);
    if (iVar8 * iVar27 < 1) {
      uVar22 = uVar16;
    }
    for (lVar21 = 0; lVar21 < iVar19; lVar21 = lVar21 + 1) {
      local_148 = (long)iVar14 << 2;
      for (uVar16 = 0; uVar16 != uVar11; uVar16 = uVar16 + 1) {
        lVar24 = lVar21 * (int)uVar10 + uVar16;
        m.elemsize = CONCAT44(top_blob_bordered.elemsize._4_4_,
                              (undefined4)top_blob_bordered.elemsize);
        m.data = (void *)(top_blob_bordered.cstep * lVar24 * m.elemsize +
                         (long)top_blob_bordered.data);
        m.refcount = (int *)0x0;
        m.packing = top_blob_bordered.packing;
        m.allocator = top_blob_bordered.allocator;
        m.dims = 2;
        m.w = top_blob_bordered.w;
        m.h = top_blob_bordered.h;
        m.c = 1;
        m.cstep = (size_t)(top_blob_bordered.h * top_blob_bordered.w);
        if (this->bias_term == 0) {
          fVar30 = 0.0;
        }
        else {
          fVar30 = *(float *)((long)(this->bias_data).data + lVar24 * 4);
        }
        pvVar4 = (this->weight_data).data;
        Mat::fill(&m,fVar30);
        for (iVar8 = 0; pvVar6 = m.data, local_1b8 = (int)uVar25, iVar8 != local_1b8;
            iVar8 = iVar8 + 1) {
          for (uVar26 = 0; pvVar6 = m.data, uVar26 != uVar20; uVar26 = uVar26 + 1) {
            lVar24 = (long)(int)uVar26 * (long)this->stride_w * 4 +
                     (long)m.w * (long)this->stride_h * (long)iVar8 * m.elemsize;
            lVar17 = (long)pvVar4 + local_148;
            for (iVar27 = 0; iVar27 != iVar13; iVar27 = iVar27 + 1) {
              Mat::channel(&m_1,bottom_blob,iVar27 + iVar23 * (int)lVar21);
              fVar30 = *(float *)((long)m_1.data +
                                 uVar26 * 4 + (long)m_1.w * (long)iVar8 * m_1.elemsize);
              for (uVar12 = 0; uVar28 != uVar12; uVar12 = uVar12 + 1) {
                *(float *)((long)pvVar6 +
                          (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar12] * 4 + lVar24) =
                     *(float *)(lVar17 + uVar12 * 4) * fVar30 +
                     *(float *)((long)pvVar6 +
                               (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start[uVar12] * 4 + lVar24);
              }
              Mat::~Mat(&m_1);
              lVar17 = lVar17 + __n * 4;
            }
          }
        }
        switch(this->activation_type) {
        case 1:
          for (uVar26 = 0; uVar22 != uVar26; uVar26 = uVar26 + 1) {
            fVar30 = *(float *)((long)m.data + uVar26 * 4);
            if (fVar30 <= 0.0) {
              fVar30 = 0.0;
            }
            *(float *)((long)m.data + uVar26 * 4) = fVar30;
          }
          break;
        case 2:
          uVar3 = *(this->activation_params).data;
          for (uVar26 = 0; uVar22 != uVar26; uVar26 = uVar26 + 1) {
            fVar30 = *(float *)((long)m.data + uVar26 * 4);
            uVar29 = -(uint)(0.0 < fVar30);
            *(float *)((long)m.data + uVar26 * 4) =
                 (float)(~uVar29 & uVar3 | uVar29 & 0x3f800000) * fVar30;
          }
          break;
        case 3:
          pfVar5 = (float *)(this->activation_params).data;
          fVar30 = *pfVar5;
          fVar1 = pfVar5[1];
          for (uVar26 = 0; uVar22 != uVar26; uVar26 = uVar26 + 1) {
            fVar2 = *(float *)((long)m.data + uVar26 * 4);
            fVar31 = fVar2;
            if (fVar2 <= fVar30) {
              fVar31 = fVar30;
            }
            if ((fVar2 < fVar30) || (fVar1 < fVar31)) {
              if (fVar1 <= fVar31) {
                fVar31 = fVar1;
              }
              *(float *)((long)m.data + uVar26 * 4) = fVar31;
            }
          }
          break;
        case 4:
          for (uVar26 = 0; uVar22 != uVar26; uVar26 = uVar26 + 1) {
            fVar30 = expf(-*(float *)((long)pvVar6 + uVar26 * 4));
            *(float *)((long)pvVar6 + uVar26 * 4) = 1.0 / (fVar30 + 1.0);
          }
        }
        Mat::~Mat(&m);
        local_148 = local_148 + (long)(int)(iVar23 * uVar9) * 4;
      }
      iVar19 = this->group;
      iVar14 = iVar14 + uVar10 * iVar23 * uVar9;
    }
  }
  iVar23 = this->pad_w;
  iVar8 = this->pad_h;
  if (iVar8 < 1 && iVar23 < 1) {
    Mat::operator=(top_blob,&top_blob_bordered);
LAB_00141838:
    iVar19 = 0;
  }
  else {
    copy_cut_border(&top_blob_bordered,top_blob,iVar8,iVar8,iVar23,iVar23,opt->blob_allocator,
                    opt->num_threads);
    iVar19 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
    goto LAB_00141838;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
LAB_00141847:
  Mat::~Mat(&top_blob_bordered);
  return iVar19;
}

Assistant:

int DeconvolutionDepthWise::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    if (channels % group != 0 || num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w;
    int outh = (h - 1) * stride_h + kernel_extent_h;

    Mat top_blob_bordered;
    if (pad_w > 0 || pad_h > 0)
    {
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.workspace_allocator);
        if (top_blob_bordered.empty())
            return -100;
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.blob_allocator);
        if (top_blob_bordered.empty())
            return -100;
    }

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = outw * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // depth-wise
    if (channels == group && group == num_output)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            const float* inptr = bottom_blob.channel(g);
            const float* kptr = (const float*)weight_data + maxk * g;
            Mat m = top_blob_bordered.channel(g);

            const float bias = bias_term ? bias_data[g] : 0.f;

            m.fill(bias);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    float* outptr = m.row(i*stride_h) + j*stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = inptr[i*w + j];
                        float w = kptr[k];
                        outptr[ space_ofs[k] ] += val * w;
                    }
                }
            }


            if (activation_type == 1)
            {
                float* outptr = m;
                int size = outw * outh;

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = std::max(outptr[i], 0.f);
                }
            }
            else if (activation_type == 2)
            {
                float* outptr = m;
                int size = outw * outh;
                float slope = activation_params[0];

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = outptr[i] > 0.f ? outptr[i] : outptr[i] * slope;
                }
            }
            else if (activation_type == 3)
            {
                float* outptr = m;
                int size = outw * outh;
                float min = activation_params[0];
                float max = activation_params[1];

                for (int i = 0; i < size; i++)
                {
                    if (outptr[i] < min)
                        outptr[i] = min;
                    if (outptr[i] > max)
                        outptr[i] = max;
                }
            }
            else if (activation_type == 4)
            {
                float* outptr = m;
                int size = outw * outh;

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = 1.f / (1.f + exp(-outptr[i]));
                }
            }
        }
    }
    else
    {
        // num_output
        const int channels_g = channels / group;
        const int num_output_g = num_output / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else // _WIN32
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif // _WIN32
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < num_output_g; p++)
            {
                Mat out = top_blob_bordered.channel(g * num_output_g + p);

                const float* weight_data_ptr = (const float*)weight_data + maxk * channels_g * num_output_g * g;
                const float bias = bias_term ? bias_data[g * num_output_g + p] : 0.f;

                out.fill(bias);

                for (int i = 0; i < h; i++)
                {
                    for (int j = 0; j < w; j++)
                    {
                        float* outptr = out.row(i*stride_h) + j*stride_w;

                        const float* kptr = weight_data_ptr + maxk * channels_g * p;

                        // channels_g
                        for (int q = 0; q < channels_g; q++)
                        {
                            const Mat m = bottom_blob.channel(channels_g * g + q);
                            float val = *(m.row(i) + j);

                            for (int k = 0; k < maxk; k++)
                            {
                                outptr[ space_ofs[k] ] += val * kptr[k];
                            }

                            kptr += maxk;
                        }
                    }
                }

                if (activation_type == 1)
                {
                    float* outptr = out;
                    int size = outw * outh;

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = std::max(outptr[i], 0.f);
                    }
                }
                else if (activation_type == 2)
                {
                    float* outptr = out;
                    int size = outw * outh;
                    float slope = activation_params[0];

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = outptr[i] > 0.f ? outptr[i] : outptr[i] * slope;
                    }
                }
                else if (activation_type == 3)
                {
                    float* outptr = out;
                    int size = outw * outh;
                    float min = activation_params[0];
                    float max = activation_params[1];

                    for (int i = 0; i < size; i++)
                    {
                        if (outptr[i] < min)
                            outptr[i] = min;
                        if (outptr[i] > max)
                            outptr[i] = max;
                    }
                }
                else if (activation_type == 4)
                {
                    float* outptr = out;
                    int size = outw * outh;

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = 1.f / (1.f + exp(-outptr[i]));
                    }
                }
            }
        }
    }

    if (pad_w > 0 || pad_h > 0)
    {
        copy_cut_border(top_blob_bordered, top_blob, pad_h, pad_h, pad_w, pad_w, opt.blob_allocator, opt.num_threads);
        if (top_blob.empty())
            return -100;

        outw = top_blob.w;
        outh = top_blob.h;
    }
    else
    {
        top_blob = top_blob_bordered;
    }

    return 0;
}